

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

Value * __thiscall
wabt::Decompiler::Set<(wabt::ExprType)25>
          (Value *__return_storage_ptr__,Decompiler *this,Value *child,
          VarExpr<(wabt::ExprType)25> *ve)

{
  string_view sVar1;
  string_view prefix;
  string s;
  char *local_50;
  size_t local_48;
  char local_40;
  undefined7 uStack_3f;
  
  if ((ve->var).type_ == Name) {
    sVar1._M_str = (ve->var).field_2.name_._M_dataplus._M_p;
    sVar1._M_len = (ve->var).field_2.name_._M_string_length;
    sVar1 = VarName(this,sVar1);
    local_48 = 0;
    local_40 = '\0';
    local_50 = &local_40;
    std::__cxx11::string::reserve((ulong)&local_50);
    std::__cxx11::string::append((char *)&local_50,(ulong)sVar1._M_str);
    std::__cxx11::string::append((char *)&local_50,0x1e3839);
    prefix._M_str = local_50;
    prefix._M_len = local_48;
    WrapChild(__return_storage_ptr__,this,child,prefix,(string_view)(ZEXT816(0x1d8861) << 0x40),
              Assign);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("is_name()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                ,0x3e,"const std::string &wabt::Var::name() const");
}

Assistant:

Value Set(Value& child, const VarExpr<T>& ve) {
    return WrapChild(child, VarName(ve.var.name()) + " = ", "",
                     Precedence::Assign);
  }